

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::RemoveEmptyBlockVisitor::~RemoveEmptyBlockVisitor(RemoveEmptyBlockVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002a8388;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto stmt_count = top->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = top->get_stmt(i);
            if (!dispatch_node(stmt)) stmts_to_remove.emplace_back(stmt);
        }
        for (auto const& stmt : stmts_to_remove) {
            top->remove_stmt(stmt);
        }
    }